

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

zip_t * zip_open(char *zipname,int level,char mode)

{
  mz_bool mVar1;
  zip_t *pZip;
  uint uVar2;
  
  if ((zipname != (char *)0x0) && (*zipname != '\0')) {
    uVar2 = 6;
    if (-1 < level) {
      uVar2 = level;
    }
    if (((uVar2 & 0xf) < 0xb) && (pZip = (zip_t *)calloc(1,0x4e078), pZip != (zip_t *)0x0)) {
      pZip->level = uVar2;
      if ((mode == 'a') || (mode == 'r')) {
        mVar1 = mz_zip_reader_init_file((mz_zip_archive *)pZip,zipname,uVar2 | 0x800);
        if (mVar1 != 0) {
          if (mode != 'a') {
            return pZip;
          }
          mVar1 = mz_zip_writer_init_from_reader((mz_zip_archive *)pZip,zipname);
          if (mVar1 != 0) {
            return pZip;
          }
          mz_zip_reader_end((mz_zip_archive *)pZip);
        }
      }
      else if ((mode == 'w') &&
              (mVar1 = mz_zip_writer_init_file((mz_zip_archive *)pZip,zipname,0), mVar1 != 0)) {
        return pZip;
      }
      goto LAB_003a2d4f;
    }
  }
  pZip = (zip_t *)0x0;
LAB_003a2d4f:
  free(pZip);
  return (zip_t *)0x0;
}

Assistant:

struct zip_t *zip_open(const char *zipname, int level, char mode) {
  struct zip_t *zip = NULL;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    goto cleanup;
  }

  if (level < 0)
    level = MZ_DEFAULT_LEVEL;
  if ((level & 0xF) > MZ_UBER_COMPRESSION) {
    // Wrong compression level
    goto cleanup;
  }

  zip = (struct zip_t *)calloc((size_t)1, sizeof(struct zip_t));
  if (!zip)
    goto cleanup;

  zip->level = (mz_uint)level;
  switch (mode) {
  case 'w':
    // Create a new archive.
    if (!mz_zip_writer_init_file(&(zip->archive), zipname, 0)) {
      // Cannot initialize zip_archive writer
      goto cleanup;
    }
    break;

  case 'r':
  case 'a':
    if (!mz_zip_reader_init_file(
            &(zip->archive), zipname,
            zip->level | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY)) {
      // An archive file does not exist or cannot initialize
      // zip_archive reader
      goto cleanup;
    }
    if (mode == 'a' &&
        !mz_zip_writer_init_from_reader(&(zip->archive), zipname)) {
      mz_zip_reader_end(&(zip->archive));
      goto cleanup;
    }
    break;

  default:
    goto cleanup;
  }

  return zip;

cleanup:
  CLEANUP(zip);
  return NULL;
}